

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cansniffer.c
# Opt level: O0

int handle_frame(int fd,long currcms)

{
  ulong uVar1;
  long in_RSI;
  int in_EDI;
  canfd_frame cf;
  int pos;
  int i;
  int nbytes;
  _Bool run_qsort;
  _Bool rx_changed;
  long local_70;
  uint local_68;
  byte local_64;
  char acStack_60 [64];
  int local_20;
  int local_1c;
  int local_18;
  byte local_12;
  byte local_11;
  long local_10;
  int local_8;
  int local_4;
  
  local_11 = 0;
  local_12 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  uVar1 = read(in_EDI,&local_68,0x48);
  local_18 = (int)uVar1;
  if (local_18 < 0) {
    perror("raw read");
    local_4 = 0;
  }
  else if ((local_18 == 0x10) || (local_18 == 0x48)) {
    if (canfd_mode == 2) {
      if (local_18 == 0x10) {
        max_dlen = 8;
        name_sep = '#';
        print_ascii = 1;
      }
      canfd_mode = (long)(local_18 != 0x10);
    }
    if ((canfd_mode == 0) && (local_18 == 0x48)) {
      local_4 = 1;
    }
    else if ((canfd_mode == 1) && (local_18 == 0x10)) {
      local_4 = 1;
    }
    else {
      if ((print_eff == 0) && ((local_68 & 0x80000000) != 0)) {
        print_eff = 1;
        clearscreen = 1;
      }
      local_20 = sniftab_index(local_68);
      if (local_20 < 0) {
        if (0x7ff < idx) {
          perror("number of different CAN IDs exceeded MAX_SLOTS");
          return 0;
        }
        local_20 = idx;
        local_11 = 1;
        local_12 = 1;
        idx = idx + 1;
      }
      else if (local_64 == sniftab[local_20].current.len) {
        for (local_1c = 0; local_1c < (int)(uint)local_64; local_1c = local_1c + 1) {
          if (acStack_60[local_1c] != *(char *)((long)local_20 * 0x158 + 0x107208 + (long)local_1c))
          {
            local_11 = 1;
            break;
          }
        }
      }
      else {
        local_11 = 1;
      }
      if ((sniftab[local_20].laststamp.tv_sec == 0) && (sniftab[local_20].laststamp.tv_usec == 0)) {
        local_11 = 1;
      }
      if ((local_11 & 1) == 1) {
        sniftab[local_20].laststamp.tv_sec = sniftab[local_20].currstamp.tv_sec;
        sniftab[local_20].laststamp.tv_usec = sniftab[local_20].currstamp.tv_usec;
        ioctl(local_8,0x8906,(long)local_20 * 0x158 + 0x1071a8);
        memcpy(&sniftab[local_20].current,&local_68,0x48);
        for (local_1c = 0; local_1c < max_dlen; local_1c = local_1c + 1) {
          *(byte *)((long)local_20 * 0x158 + 0x107250 + (long)local_1c) =
               *(byte *)((long)local_20 * 0x158 + 0x107250 + (long)local_1c) |
               *(byte *)((long)local_20 * 0x158 + 0x107208 + (long)local_1c) ^
               *(byte *)((long)local_20 * 0x158 + 0x1071c0 + (long)local_1c);
        }
        if (timeout == 0) {
          local_70 = 0;
        }
        else {
          local_70 = local_10 + timeout;
        }
        sniftab[local_20].timeout = local_70;
        if ((sniftab[local_20].flags & 2U) == 0) {
          clearscreen = 1;
        }
        sniftab[local_20].flags = sniftab[local_20].flags | 2;
        sniftab[local_20].flags = sniftab[local_20].flags | 4;
      }
      if ((local_12 & 1) == 1) {
        qsort(sniftab,(long)idx,0x158,comp);
      }
      local_4 = 1;
    }
  }
  else {
    printf("received strange frame data length %d!\n",uVar1 & 0xffffffff);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int handle_frame(int fd, long currcms)
{
	bool rx_changed = false;
	bool run_qsort = false;
	int nbytes, i, pos;
	struct canfd_frame cf;

	nbytes = read(fd, &cf, sizeof(cf));
	if (nbytes < 0) {
		perror("raw read");
		return 0; /* quit */
	}

	if ((nbytes != CAN_MTU) && (nbytes != CANFD_MTU)) {
		printf("received strange frame data length %d!\n", nbytes);
		return 0; /* quit */
	}

	/* CAN FD auto mode: switch based on first reception */
	if (canfd_mode == CANFD_AUTO) {
		if (nbytes == CAN_MTU) {
			canfd_mode = CANFD_OFF;
			/* change back auto defaults for Classical CAN */
			max_dlen = CAN_MAX_DLEN;
			name_sep = CC_SEP;
			print_ascii = 1;
		} else {
			canfd_mode = CANFD_ON;
		}
	}

	/* filter for Classical CAN */
	if ((canfd_mode == CANFD_OFF) && (nbytes == CANFD_MTU))
		return 1; /* skip handling */

	/* filter for CAN FD */
	if ((canfd_mode == CANFD_ON) && (nbytes == CAN_MTU))
		return 1; /* skip handling */

	if (!print_eff && (cf.can_id & CAN_EFF_FLAG)) {
		print_eff = 1;
		clearscreen = 1;
	}

	pos = sniftab_index(cf.can_id);
	if (pos < 0) {
		/* CAN ID not existing */
		if (idx >= MAX_SLOTS) {
			/* informative exit */
			perror("number of different CAN IDs exceeded MAX_SLOTS");
			return 0; /* quit */
		}
		/* assign new slot */
		pos = idx++;
		rx_changed = true;
		run_qsort = true;
	}
	else {
		if (cf.len == sniftab[pos].current.len)
			for (i = 0; i < cf.len; i++) {
				if (cf.data[i] != sniftab[pos].current.data[i] ) {
					rx_changed = true;
					break;
				}
			}
		else
			rx_changed = true;
	}

	/* print received frame even if the data didn't change to get a gap time */
	if ((sniftab[pos].laststamp.tv_sec == 0) && (sniftab[pos].laststamp.tv_usec == 0))
		rx_changed = true;

	if (rx_changed == true) {
		sniftab[pos].laststamp = sniftab[pos].currstamp;
		ioctl(fd, SIOCGSTAMP, &sniftab[pos].currstamp);

		sniftab[pos].current = cf;
		for (i = 0; i < max_dlen; i++)
			sniftab[pos].marker.data[i] |= sniftab[pos].current.data[i] ^ sniftab[pos].last.data[i];

		sniftab[pos].timeout = (timeout)?(currcms + timeout):0;

		if (is_clr(pos, DISPLAY))
			clearscreen = 1; /* new entry -> new drawing */

		do_set(pos, DISPLAY);
		do_set(pos, UPDATE);
	}

	if (run_qsort == true)
		qsort(sniftab, idx, sizeof(sniftab[0]), comp);

	return 1; /* ok */
}